

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# searchIOF.cpp
# Opt level: O2

void printnode(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *c,datanode *node,int nsize)

{
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38," ( ",&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)c,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  print_IO(node,c,nsize);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(c);
  std::__cxx11::string::string((string *)&local_38,")",&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)c,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"input Clk, Rst",&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)c,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  print_IOWG(node,c,nsize);
  std::__cxx11::string::string((string *)&local_38,";",&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)c,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void printnode(vector<string> &c, struct datanode *node,int nsize)
{
	int i = 0;
	c.push_back(" ( ");
	print_IO(node, c,nsize);
	c.pop_back();
	c.push_back(")");
	c.push_back("input Clk, Rst");
	print_IOWG(node, c, nsize);
	c.push_back(";");

}